

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marker-index.cc
# Opt level: O2

Point __thiscall MarkerIndex::get_node_position(MarkerIndex *this,Node *node)

{
  Node *pNVar1;
  iterator iVar2;
  __hashtable *__h;
  Node *pNVar3;
  Point *traversal;
  Point position;
  Node *local_38;
  Point local_30;
  Node *local_28;
  Point local_20;
  
  local_38 = node;
  iVar2 = std::
          _Hashtable<const_MarkerIndex::Node_*,_std::pair<const_MarkerIndex::Node_*const,_Point>,_std::allocator<std::pair<const_MarkerIndex::Node_*const,_Point>_>,_std::__detail::_Select1st,_std::equal_to<const_MarkerIndex::Node_*>,_std::hash<const_MarkerIndex::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->node_position_cache)._M_h,&local_38);
  if (iVar2.super__Node_iterator_base<std::pair<const_MarkerIndex::Node_*const,_Point>,_false>.
      _M_cur == (__node_type *)0x0) {
    local_20 = local_38->left_extent;
    traversal = &local_30;
    pNVar1 = local_38;
    local_30 = local_20;
    while (pNVar3 = pNVar1, pNVar1 = pNVar3->parent, pNVar1 != (Node *)0x0) {
      if (pNVar1->right == pNVar3) {
        local_20 = Point::traverse(&pNVar1->left_extent,traversal);
        pNVar1 = pNVar3->parent;
        local_30 = local_20;
      }
    }
    local_28 = local_38;
    std::
    _Hashtable<MarkerIndex::Node_const*,std::pair<MarkerIndex::Node_const*const,Point>,std::allocator<std::pair<MarkerIndex::Node_const*const,Point>>,std::__detail::_Select1st,std::equal_to<MarkerIndex::Node_const*>,std::hash<MarkerIndex::Node_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<MarkerIndex::Node_const*const,Point>>
              ((_Hashtable<MarkerIndex::Node_const*,std::pair<MarkerIndex::Node_const*const,Point>,std::allocator<std::pair<MarkerIndex::Node_const*const,Point>>,std::__detail::_Select1st,std::equal_to<MarkerIndex::Node_const*>,std::hash<MarkerIndex::Node_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->node_position_cache);
  }
  else {
    traversal = (Point *)((long)iVar2.
                                super__Node_iterator_base<std::pair<const_MarkerIndex::Node_*const,_Point>,_false>
                                ._M_cur + 0x10);
  }
  return *traversal;
}

Assistant:

Point MarkerIndex::get_node_position(const Node *node) const {
  auto cache_entry = node_position_cache.find(node);
  if (cache_entry == node_position_cache.end()) {
    Point position = node->left_extent;
    const Node *current_node = node;
    while (current_node->parent) {
      if (current_node->parent->right == current_node) {
        position = current_node->parent->left_extent.traverse(position);
      }

      current_node = current_node->parent;
    }
    node_position_cache.insert({node, position});
    return position;
  } else {
    return cache_entry->second;
  }
}